

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

Value __thiscall xmrig::String::toJSON(String *this)

{
  bool bVar1;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar2;
  String *in_RSI;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_RDI;
  Value VVar3;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *this_00;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_stack_ffffffffffffffe0;
  
  this_00 = in_RDI;
  bVar1 = isNull(in_RSI);
  if (bVar1) {
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    GenericValue(this_00,(Type)((ulong)in_RDI >> 0x20));
    uVar2 = extraout_RDX;
  }
  else {
    rapidjson::StringRef<char>((char *)in_RDI);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    GenericValue(in_stack_ffffffffffffffe0,(StringRefType *)in_RSI);
    uVar2 = extraout_RDX_00;
  }
  VVar3.data_.s.str = (Ch *)uVar2;
  VVar3.data_.n = (Number)this_00;
  return (Value)VVar3.data_;
}

Assistant:

rapidjson::Value xmrig::String::toJSON() const
{
    using namespace rapidjson;

    return isNull() ? Value(kNullType) : Value(StringRef(m_data));
}